

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hsva_bv(nk_byte *out,nk_color in)

{
  undefined1 local_28 [4];
  undefined1 local_24 [4];
  int tmp [4];
  nk_byte *out_local;
  nk_color in_local;
  
  tmp._8_8_ = out;
  nk_color_hsva_i((int *)local_28,(int *)local_24,tmp,tmp + 1,in);
  *(undefined1 *)tmp._8_8_ = local_28[0];
  *(undefined1 *)(tmp._8_8_ + 1) = local_24[0];
  *(undefined1 *)(tmp._8_8_ + 2) = (undefined1)tmp[0];
  *(undefined1 *)(tmp._8_8_ + 3) = (undefined1)tmp[1];
  return;
}

Assistant:

NK_API void
nk_color_hsva_bv(nk_byte *out, struct nk_color in)
{
    int tmp[4];
    nk_color_hsva_i(&tmp[0], &tmp[1], &tmp[2], &tmp[3], in);
    out[0] = (nk_byte)tmp[0];
    out[1] = (nk_byte)tmp[1];
    out[2] = (nk_byte)tmp[2];
    out[3] = (nk_byte)tmp[3];
}